

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O2

Abc_Obj_t * Abc_NtkCreateObj(Abc_Ntk_t *pNtk,Abc_ObjType_t Type)

{
  uint __line;
  Abc_Obj_t *Entry;
  Vec_Ptr_t *pVVar1;
  
  Entry = Abc_ObjAlloc(pNtk,Type);
  pVVar1 = pNtk->vObjs;
  Entry->Id = pVVar1->nSize;
  Vec_PtrPush(pVVar1,Entry);
  pNtk->nObjCounts[Type] = pNtk->nObjCounts[Type] + 1;
  pNtk->nObjs = pNtk->nObjs + 1;
  switch((ulong)Type) {
  case 0:
    __line = 0x7a;
    goto LAB_001db11d;
  case 1:
    __line = 0x7d;
LAB_001db11d:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,__line,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  case 2:
    Vec_PtrPush(pNtk->vPis,Entry);
    pVVar1 = pNtk->vCis;
    goto LAB_001db0dd;
  case 3:
    Vec_PtrPush(pNtk->vPos,Entry);
    pVVar1 = pNtk->vCos;
    goto LAB_001db0dd;
  case 4:
    pVVar1 = pNtk->vCos;
    break;
  case 5:
    pVVar1 = pNtk->vCis;
    break;
  case 6:
  case 7:
    goto switchD_001db09d_caseD_6;
  case 8:
    (Entry->field_5).pData = (void *)0x0;
  case 9:
  case 10:
    pVVar1 = pNtk->vBoxes;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcObj.c"
                  ,0x99,"Abc_Obj_t *Abc_NtkCreateObj(Abc_Ntk_t *, Abc_ObjType_t)");
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
LAB_001db0dd:
    Vec_PtrPush(pVVar1,Entry);
  }
switchD_001db09d_caseD_6:
  return Entry;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateObj( Abc_Ntk_t * pNtk, Abc_ObjType_t Type )
{
    Abc_Obj_t * pObj;
    // create new object, assign ID, and add to the array
    pObj = Abc_ObjAlloc( pNtk, Type );
    pObj->Id = pNtk->vObjs->nSize;
    Vec_PtrPush( pNtk->vObjs, pObj );
    pNtk->nObjCounts[Type]++;
    pNtk->nObjs++;
    // perform specialized operations depending on the object type
    switch (Type)
    {
        case ABC_OBJ_NONE:   
            assert(0); 
            break;
        case ABC_OBJ_CONST1: 
            assert(0); 
            break;
        case ABC_OBJ_PI:
//            pObj->iTemp = Vec_PtrSize(pNtk->vCis);
            Vec_PtrPush( pNtk->vPis, pObj );
            Vec_PtrPush( pNtk->vCis, pObj );
            break;
        case ABC_OBJ_PO:     
//            pObj->iTemp = Vec_PtrSize(pNtk->vCos);
            Vec_PtrPush( pNtk->vPos, pObj );
            Vec_PtrPush( pNtk->vCos, pObj );
            break;
        case ABC_OBJ_BI:     
            if ( pNtk->vCos ) Vec_PtrPush( pNtk->vCos, pObj );
            break;
        case ABC_OBJ_BO:     
            if ( pNtk->vCis ) Vec_PtrPush( pNtk->vCis, pObj );
            break;
        case ABC_OBJ_NET:  
        case ABC_OBJ_NODE: 
            break;
        case ABC_OBJ_LATCH:     
            pObj->pData = (void *)ABC_INIT_NONE;
        case ABC_OBJ_WHITEBOX:     
        case ABC_OBJ_BLACKBOX:     
            if ( pNtk->vBoxes ) Vec_PtrPush( pNtk->vBoxes, pObj );
            break;
        default:
            assert(0); 
            break;
    }
    return pObj;
}